

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_add_extension(nifti_image *nim,char *data,int len,int ecode)

{
  int iVar1;
  undefined1 local_38 [8];
  nifti1_extension ext;
  int ecode_local;
  int len_local;
  char *data_local;
  nifti_image *nim_local;
  
  ext.edata._0_4_ = ecode;
  ext.edata._4_4_ = len;
  iVar1 = nifti_fill_extension((nifti1_extension *)local_38,data,len,ecode);
  if (iVar1 == 0) {
    iVar1 = nifti_add_exten_to_list((nifti1_extension *)local_38,&nim->ext_list,nim->num_ext + 1);
    if (iVar1 == 0) {
      nim->num_ext = nim->num_ext + 1;
      nim_local._4_4_ = 0;
    }
    else {
      nim_local._4_4_ = -1;
    }
  }
  else {
    nim_local._4_4_ = -1;
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_add_extension(nifti_image *nim, const char * data, int len, int ecode)
{
   nifti1_extension ext;

   /* error are printed in functions */
   if( nifti_fill_extension(&ext, data, len, ecode) )                 return -1;
   if( nifti_add_exten_to_list(&ext, &nim->ext_list, nim->num_ext+1)) return -1;

   nim->num_ext++;  /* success, so increment */

   return 0;
}